

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall Builder::FinishCommand(Builder *this,Result *result,string *err)

{
  Edge *this_00;
  BuildLog *this_01;
  Metrics *this_02;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  _Base_ptr p_Var5;
  int64_t iVar6;
  long lVar7;
  pointer ppNVar8;
  long lVar9;
  long lVar10;
  int *piVar11;
  long *plVar12;
  Metric *pMVar13;
  _Base_ptr p_Var14;
  long *plVar15;
  iterator __position;
  pointer ppNVar16;
  string rspfile;
  string deps_prefix;
  string deps_type;
  vector<Node_*,_std::allocator<Node_*>_> deps_nodes;
  ScopedMetric metrics_h_scoped;
  string local_120;
  string *local_100;
  string local_f8;
  string local_d8;
  int local_b4;
  long *local_b0 [2];
  long local_a0 [2];
  long local_90;
  vector<Node_*,_std::allocator<Node_*>_> local_88;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  DependencyScan *local_50;
  Plan *local_48;
  ScopedMetric local_40;
  
  local_100 = err;
  if ((FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar4 = __cxa_guard_acquire(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                                   metrics_h_metric), this_02 = g_metrics, iVar4 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar13 = (Metric *)0x0;
    }
    else {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"FinishCommand","");
      pMVar13 = Metrics::NewMetric(this_02,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    FinishCommand::metrics_h_metric = pMVar13;
    __cxa_guard_release(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_40,FinishCommand::metrics_h_metric);
  this_00 = result->edge;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"deps","");
  Edge::GetBinding(&local_d8,this_00,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"msvc_deps_prefix","");
  Edge::GetBinding(&local_f8,this_00,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                             local_120.field_2._M_local_buf[0]) + 1);
  }
  if (local_d8._M_string_length != 0) {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    local_120._M_string_length = 0;
    local_120.field_2._M_local_buf[0] = '\0';
    bVar1 = ExtractDeps(this,result,&local_d8,&local_f8,&local_88,&local_120);
    if ((!bVar1) && (result->status == ExitSuccess)) {
      if ((result->output)._M_string_length != 0) {
        std::__cxx11::string::append((char *)&result->output);
      }
      std::__cxx11::string::_M_append((char *)&result->output,(ulong)local_120._M_dataplus._M_p);
      result->status = ExitFailure;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                               local_120.field_2._M_local_buf[0]) + 1);
    }
  }
  p_Var14 = (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __position._M_node = &(this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var5 = __position._M_node;
  if (p_Var14 != (_Base_ptr)0x0) {
    do {
      if (*(Edge **)(p_Var14 + 1) >= this_00) {
        p_Var5 = p_Var14;
      }
      p_Var14 = (&p_Var14->_M_left)[*(Edge **)(p_Var14 + 1) < this_00];
    } while (p_Var14 != (_Base_ptr)0x0);
    if ((p_Var5 != __position._M_node) && (*(Edge **)(p_Var5 + 1) <= this_00)) {
      __position._M_node = p_Var5;
    }
  }
  local_b4 = *(int *)&__position._M_node[1]._M_parent;
  iVar6 = GetTimeMillis();
  local_90 = iVar6 - this->start_time_millis_;
  std::
  _Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
  ::erase_abi_cxx11_((_Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
                      *)&this->running_edges_,__position);
  (*this->status_->_vptr_Status[2])
            (this->status_,this_00,local_90,(ulong)(result->status == ExitSuccess),&result->output);
  if (result->status != ExitSuccess) {
    bVar1 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeFailed,local_100);
    goto LAB_0010a8e5;
  }
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"restat","");
  bVar1 = Edge::GetBindingBool(this_00,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                             local_120.field_2._M_local_buf[0]) + 1);
  }
  if ((this->config_[4] == (BuildConfig)0x0) &&
     (ppNVar16 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
     ppNVar16 !=
     (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    local_48 = &this->plan_;
    local_50 = &this->scan_;
    bVar3 = false;
    lVar10 = 0;
    do {
      lVar7 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                        (this->disk_interface_,*ppNVar16,local_100);
      if (lVar7 == -1) goto LAB_0010a70a;
      if (lVar10 < lVar7) {
        lVar10 = lVar7;
      }
      if ((*ppNVar16)->mtime_ == lVar7 && bVar1) {
        bVar2 = Plan::CleanNode(local_48,local_50,*ppNVar16,local_100);
        bVar3 = true;
        if (!bVar2) goto LAB_0010a70a;
      }
      ppNVar16 = ppNVar16 + 1;
    } while (ppNVar16 !=
             (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (!bVar3) goto LAB_0010a60a;
    ppNVar8 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish + -(long)this_00->order_only_deps_;
    lVar7 = 0;
    for (ppNVar16 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppNVar16 != ppNVar8; ppNVar16 = ppNVar16 + 1)
    {
      lVar9 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                        (this->disk_interface_,*ppNVar16,local_100);
      if (lVar9 == -1) goto LAB_0010a70a;
      if (lVar7 < lVar9) {
        lVar7 = lVar9;
      }
      ppNVar8 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish + -(long)this_00->order_only_deps_;
    }
    Edge::GetUnescapedDepfile_abi_cxx11_(&local_120,this_00);
    if (lVar7 == 0) {
      lVar7 = 0;
LAB_0010a8a8:
      bVar1 = true;
      (**this->status_->_vptr_Status)(this->status_,(ulong)(uint)(this->plan_).command_edges_);
    }
    else {
      if ((local_d8._M_string_length != 0) || (local_120._M_string_length == 0)) goto LAB_0010a8a8;
      lVar9 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                        (this->disk_interface_,&local_120,local_100);
      if (lVar7 < lVar9) {
        lVar7 = lVar9;
      }
      if (lVar9 != -1) goto LAB_0010a8a8;
      bVar1 = false;
      lVar7 = lVar10;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                               local_120.field_2._M_local_buf[0]) + 1);
    }
    lVar10 = lVar7;
    if (bVar1) goto LAB_0010a60a;
  }
  else {
    lVar10 = 0;
LAB_0010a60a:
    bVar1 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeSucceeded,local_100);
    if (bVar1) {
      Edge::GetUnescapedRspfile_abi_cxx11_(&local_120,this_00);
      if ((local_120._M_string_length != 0) && (g_keep_rsp == false)) {
        (**(code **)(*(long *)this->disk_interface_ + 0x30))(this->disk_interface_,&local_120);
      }
      this_01 = (this->scan_).build_log_;
      if ((this_01 == (BuildLog *)0x0) ||
         (bVar1 = BuildLog::RecordCommand(this_01,this_00,local_b4,(int)local_90,lVar10), bVar1)) {
        bVar1 = true;
        if ((local_d8._M_string_length != 0) && (this->config_[4] == (BuildConfig)0x0)) {
          ppNVar16 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
          if (ppNVar16 ==
              (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            __assert_fail("!edge->outputs_.empty() && \"should have been rejected by parser\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc"
                          ,899,"bool Builder::FinishCommand(CommandRunner::Result *, string *)");
          }
          do {
            lVar10 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                               (this->disk_interface_,*ppNVar16,local_100);
            bVar1 = lVar10 != -1;
            if (lVar10 == -1) break;
            bVar3 = DepsLog::RecordDeps((this->scan_).dep_loader_.deps_log_,*ppNVar16,lVar10,
                                        &local_88);
            if (!bVar3) {
              local_b0[0] = local_a0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_b0,"Error writing to deps log: ","");
              piVar11 = __errno_location();
              strerror(*piVar11);
              plVar12 = (long *)std::__cxx11::string::append((char *)local_b0);
              goto LAB_0010a74e;
            }
            ppNVar16 = ppNVar16 + 1;
          } while (ppNVar16 !=
                   (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
      }
      else {
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b0,"Error writing to build log: ","");
        piVar11 = __errno_location();
        strerror(*piVar11);
        plVar12 = (long *)std::__cxx11::string::append((char *)local_b0);
LAB_0010a74e:
        plVar15 = plVar12 + 2;
        if ((long *)*plVar12 == plVar15) {
          local_60 = *plVar15;
          lStack_58 = plVar12[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar15;
          local_70 = (long *)*plVar12;
        }
        local_68 = plVar12[1];
        *plVar12 = (long)plVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_100,(string *)&local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        bVar1 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,
                        CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                                 local_120.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0010a8e5;
    }
  }
  bVar1 = false;
LAB_0010a8e5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ScopedMetric::~ScopedMetric(&local_40);
  return bVar1;
LAB_0010a70a:
  bVar1 = false;
  goto LAB_0010a8e5;
}

Assistant:

bool Builder::FinishCommand(CommandRunner::Result* result, string* err) {
  METRIC_RECORD("FinishCommand");

  Edge* edge = result->edge;

  // First try to extract dependencies from the result, if any.
  // This must happen first as it filters the command output (we want
  // to filter /showIncludes output, even on compile failure) and
  // extraction itself can fail, which makes the command fail from a
  // build perspective.
  vector<Node*> deps_nodes;
  string deps_type = edge->GetBinding("deps");
  const string deps_prefix = edge->GetBinding("msvc_deps_prefix");
  if (!deps_type.empty()) {
    string extract_err;
    if (!ExtractDeps(result, deps_type, deps_prefix, &deps_nodes,
                     &extract_err) &&
        result->success()) {
      if (!result->output.empty())
        result->output.append("\n");
      result->output.append(extract_err);
      result->status = ExitFailure;
    }
  }

  int64_t start_time_millis, end_time_millis;
  RunningEdgeMap::iterator it = running_edges_.find(edge);
  start_time_millis = it->second;
  end_time_millis = GetTimeMillis() - start_time_millis_;
  running_edges_.erase(it);

  status_->BuildEdgeFinished(edge, end_time_millis, result->success(),
                             result->output);

  // The rest of this function only applies to successful commands.
  if (!result->success()) {
    return plan_.EdgeFinished(edge, Plan::kEdgeFailed, err);
  }

  // Restat the edge outputs
  TimeStamp output_mtime = 0;
  bool restat = edge->GetBindingBool("restat");
  if (!config_.dry_run) {
    bool node_cleaned = false;

    for (vector<Node*>::iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp new_mtime = disk_interface_->Stat((*o)->path(), err);
      if (new_mtime == -1)
        return false;
      if (new_mtime > output_mtime)
        output_mtime = new_mtime;
      if ((*o)->mtime() == new_mtime && restat) {
        // The rule command did not change the output.  Propagate the clean
        // state through the build graph.
        // Note that this also applies to nonexistent outputs (mtime == 0).
        if (!plan_.CleanNode(&scan_, *o, err))
          return false;
        node_cleaned = true;
      }
    }

    if (node_cleaned) {
      TimeStamp restat_mtime = 0;
      // If any output was cleaned, find the most recent mtime of any
      // (existing) non-order-only input or the depfile.
      for (vector<Node*>::iterator i = edge->inputs_.begin();
           i != edge->inputs_.end() - edge->order_only_deps_; ++i) {
        TimeStamp input_mtime = disk_interface_->Stat((*i)->path(), err);
        if (input_mtime == -1)
          return false;
        if (input_mtime > restat_mtime)
          restat_mtime = input_mtime;
      }

      string depfile = edge->GetUnescapedDepfile();
      if (restat_mtime != 0 && deps_type.empty() && !depfile.empty()) {
        TimeStamp depfile_mtime = disk_interface_->Stat(depfile, err);
        if (depfile_mtime == -1)
          return false;
        if (depfile_mtime > restat_mtime)
          restat_mtime = depfile_mtime;
      }

      // The total number of edges in the plan may have changed as a result
      // of a restat.
      status_->PlanHasTotalEdges(plan_.command_edge_count());

      output_mtime = restat_mtime;
    }
  }

  if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err))
    return false;

  // Delete any left over response file.
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty() && !g_keep_rsp)
    disk_interface_->RemoveFile(rspfile);

  if (scan_.build_log()) {
    if (!scan_.build_log()->RecordCommand(edge, start_time_millis,
                                          end_time_millis, output_mtime)) {
      *err = string("Error writing to build log: ") + strerror(errno);
      return false;
    }
  }

  if (!deps_type.empty() && !config_.dry_run) {
    assert(!edge->outputs_.empty() && "should have been rejected by parser");
    for (std::vector<Node*>::const_iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp deps_mtime = disk_interface_->Stat((*o)->path(), err);
      if (deps_mtime == -1)
        return false;
      if (!scan_.deps_log()->RecordDeps(*o, deps_mtime, deps_nodes)) {
        *err = std::string("Error writing to deps log: ") + strerror(errno);
        return false;
      }
    }
  }
  return true;
}